

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.cxx
# Opt level: O2

bool __thiscall cmListFileParser::Parse(cmListFileParser *this)

{
  cmMessenger *this_00;
  bool bVar1;
  cmListFileLexer_Token *pcVar2;
  ostream *poVar3;
  char *pcVar4;
  allocator<char> local_259;
  string local_258;
  long *local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_230;
  cmConstStack<cmListFileContext,_cmListFileBacktrace> local_228;
  cmListFileContext local_218;
  ostringstream error;
  bool local_138;
  
  local_230 = &this->FunctionName;
  local_238 = &this->FunctionLine;
  bVar1 = true;
  do {
    pcVar2 = cmListFileLexer_Scan(this->Lexer);
    if (pcVar2 == (cmListFileLexer_Token *)0x0) {
      CheckNesting((optional<cmListFileContext> *)&error,this);
      if (local_138 == true) {
        this_00 = this->Messenger;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_258,"Flow control statements are not properly nested.",
                   &local_259);
        cmListFileContext::cmListFileContext(&local_218,(cmListFileContext *)&error);
        cmConstStack<cmListFileContext,_cmListFileBacktrace>::Push
                  (&local_228,(cmListFileContext *)&this->Backtrace);
        cmMessenger::IssueMessage(this_00,FATAL_ERROR,&local_258,(cmListFileBacktrace *)&local_228);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_228.TopEntry.
                    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
        cmListFileContext::~cmListFileContext(&local_218);
        std::__cxx11::string::~string((string *)&local_258);
        cmSystemTools::s_FatalErrorOccurred = true;
      }
      std::_Optional_payload_base<cmListFileContext>::_M_reset
                ((_Optional_payload_base<cmListFileContext> *)&error);
      return (bool)(local_138 ^ 1);
    }
    switch(pcVar2->type) {
    case cmListFileLexer_Token_Space:
      break;
    case cmListFileLexer_Token_Newline:
      bVar1 = true;
      break;
    case cmListFileLexer_Token_Identifier:
      if (!bVar1) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&error);
        poVar3 = std::operator<<((ostream *)&error,"Parse error.  Expected a newline, got ");
        pcVar4 = cmListFileLexer_GetTypeAsString(this->Lexer,pcVar2->type);
        poVar3 = std::operator<<(poVar3,pcVar4);
        poVar3 = std::operator<<(poVar3," with text \"");
        poVar3 = std::operator<<(poVar3,pcVar2->text);
        std::operator<<(poVar3,"\".");
        std::__cxx11::stringbuf::str();
        IssueError(this,&local_258);
        goto LAB_002295bd;
      }
      bVar1 = ParseFunction(this,pcVar2->text,(long)pcVar2->line);
      if (!bVar1) {
        return false;
      }
      std::vector<cmListFileFunction,std::allocator<cmListFileFunction>>::
      emplace_back<std::__cxx11::string,long&,long&,std::vector<cmListFileArgument,std::allocator<cmListFileArgument>>>
                ((vector<cmListFileFunction,std::allocator<cmListFileFunction>> *)this->ListFile,
                 local_230,local_238,&this->FunctionLineEnd,&this->FunctionArguments);
    case cmListFileLexer_Token_CommentBracket:
      bVar1 = false;
      break;
    default:
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&error);
      poVar3 = std::operator<<((ostream *)&error,"Parse error.  Expected a command name, got ");
      pcVar4 = cmListFileLexer_GetTypeAsString(this->Lexer,pcVar2->type);
      poVar3 = std::operator<<(poVar3,pcVar4);
      poVar3 = std::operator<<(poVar3," with text \"");
      poVar3 = std::operator<<(poVar3,pcVar2->text);
      std::operator<<(poVar3,"\".");
      std::__cxx11::stringbuf::str();
      IssueError(this,&local_258);
LAB_002295bd:
      std::__cxx11::string::~string((string *)&local_258);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error);
      return false;
    }
  } while( true );
}

Assistant:

bool cmListFileParser::Parse()
{
  // Use a simple recursive-descent parser to process the token
  // stream.
  bool haveNewline = true;
  while (cmListFileLexer_Token* token = cmListFileLexer_Scan(this->Lexer)) {
    if (token->type == cmListFileLexer_Token_Space) {
    } else if (token->type == cmListFileLexer_Token_Newline) {
      haveNewline = true;
    } else if (token->type == cmListFileLexer_Token_CommentBracket) {
      haveNewline = false;
    } else if (token->type == cmListFileLexer_Token_Identifier) {
      if (haveNewline) {
        haveNewline = false;
        if (this->ParseFunction(token->text, token->line)) {
          this->ListFile->Functions.emplace_back(
            std::move(this->FunctionName), this->FunctionLine,
            this->FunctionLineEnd, std::move(this->FunctionArguments));
        } else {
          return false;
        }
      } else {
        std::ostringstream error;
        error << "Parse error.  Expected a newline, got "
              << cmListFileLexer_GetTypeAsString(this->Lexer, token->type)
              << " with text \"" << token->text << "\".";
        this->IssueError(error.str());
        return false;
      }
    } else {
      std::ostringstream error;
      error << "Parse error.  Expected a command name, got "
            << cmListFileLexer_GetTypeAsString(this->Lexer, token->type)
            << " with text \"" << token->text << "\".";
      this->IssueError(error.str());
      return false;
    }
  }

  // Check if all functions are nested properly.
  if (auto badNesting = this->CheckNesting()) {
    this->Messenger->IssueMessage(
      MessageType::FATAL_ERROR,
      "Flow control statements are not properly nested.",
      this->Backtrace.Push(*badNesting));
    cmSystemTools::SetFatalErrorOccurred();
    return false;
  }

  return true;
}